

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::CalculateP2SH(Address *this,ByteData160 *hash_data,uint8_t prefix)

{
  int iVar1;
  NetType_conflict NVar2;
  CfdException *this_00;
  undefined7 in_register_00000011;
  char *wally_string;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  uint8_t addr_prefix;
  int ret;
  undefined1 local_70 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> address_data;
  CfdSourceLocation local_38;
  char *output;
  
  ByteData160::GetBytes(&address_data,hash_data);
  addr_prefix = prefix;
  if (((int)CONCAT71(in_register_00000011,prefix) == 0) && ((ulong)(uint)this->type_ < 3)) {
    addr_prefix = AddressFormatData::GetP2shPrefix
                            ((AddressFormatData *)
                             ((ulong)(uint)this->type_ * 0x30 + kBitcoinAddressFormatList));
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&this->format_data_,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((ulong)(uint)this->type_ * 0x30 + kBitcoinAddressFormatList));
    NVar2 = AddressFormatData::GetNetType(&this->format_data_);
    this->type_ = NVar2;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&address_data,
             (const_iterator)
             address_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,&addr_prefix);
  output = (char *)0x0;
  ret = wally_base58_from_bytes
                  (address_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)address_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)address_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,1);
  if (ret == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_70,(WallyUtil *)output,wally_string);
    ::std::__cxx11::string::operator=((string *)&this->address_,(string *)local_70);
    ::std::__cxx11::string::~string((string *)local_70);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&address_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_70._0_8_ = "cfdcore_address.cpp";
  local_70._8_4_ = 0x348;
  local_70._16_8_ = "CalculateP2SH";
  logger::warn<int&>((CfdSourceLocation *)local_70,"wally_base58_from_bytes error. ret={}.",&ret);
  local_38.filename = "cfdcore_address.cpp";
  local_38.line = 0x34a;
  local_38.funcname = "CalculateP2SH";
  StringUtil::ByteToString_abi_cxx11_((string *)local_70,(StringUtil *)&address_data,bytes);
  logger::info<std::__cxx11::string>
            (&local_38,"input hash={}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  ::std::__cxx11::string::~string((string *)local_70);
  iVar1 = ret;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  if (iVar1 == -2) {
    ::std::__cxx11::string::string((string *)local_70,"Base58 encode error.",(allocator *)&local_38)
    ;
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::string((string *)local_70,"Base58 encode error.",(allocator *)&local_38);
  CfdException::CfdException(this_00,kCfdInternalError,(string *)local_70);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Address::CalculateP2SH(const ByteData160& hash_data, uint8_t prefix) {
  std::vector<uint8_t> address_data = hash_data.GetBytes();

  // Add first to the list the Address Prefix
  uint8_t addr_prefix = prefix;
  if ((addr_prefix == 0) && (kMainnet <= type_) && (type_ <= kRegtest)) {
    addr_prefix = kBitcoinAddressFormatList[type_].GetP2shPrefix();
    format_data_ = kBitcoinAddressFormatList[type_];
    SetNetType(format_data_);
  }
  address_data.insert(address_data.begin(), addr_prefix);

  char* output = NULL;
  uint32_t flags = BASE58_FLAG_CHECKSUM;
  int ret = wally_base58_from_bytes(
      address_data.data(), address_data.size(), flags, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_from_bytes error. ret={}.", ret);
    info(
        CFD_LOG_SOURCE, "input hash={}",
        StringUtil::ByteToString(address_data));
    if (ret == WALLY_EINVAL) {
      throw CfdException(kCfdIllegalArgumentError, "Base58 encode error.");
    } else {
      throw CfdException(kCfdInternalError, "Base58 encode error.");
    }
  }

  address_ = WallyUtil::ConvertStringAndFree(output);
}